

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prepare.c
# Opt level: O0

int luv_new_prepare(lua_State *L)

{
  int status;
  uv_prepare_t *handle_00;
  uv_loop_t *loop;
  luv_handle_t *plVar1;
  int ret;
  uv_prepare_t *handle;
  lua_State *L_local;
  
  handle_00 = (uv_prepare_t *)luv_newuserdata(L,0x78);
  loop = luv_loop(L);
  status = uv_prepare_init(loop,handle_00);
  if (status < 0) {
    lua_settop(L,-2);
    L_local._4_4_ = luv_error(L,status);
  }
  else {
    plVar1 = luv_setup_handle(L);
    handle_00->data = plVar1;
    L_local._4_4_ = 1;
  }
  return L_local._4_4_;
}

Assistant:

static int luv_new_prepare(lua_State* L) {
  luv_ctx_t* ctx = luv_context(L);
  uv_prepare_t* handle = (uv_prepare_t*)luv_newuserdata(L, sizeof(*handle));
  int ret = uv_prepare_init(ctx->loop, handle);
  if (ret < 0) {
    lua_pop(L, 1);
    return luv_error(L, ret);
  }
  handle->data = luv_setup_handle(L, ctx);
  return 1;
}